

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlValidateOneAttribute
              (xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,xmlAttrPtr attr,xmlChar *value)

{
  xmlChar *prefix;
  int iVar1;
  xmlAttributeType xVar2;
  uint uVar3;
  xmlChar *pxVar4;
  xmlAttributePtr pxVar5;
  xmlIDPtr pxVar6;
  xmlRefPtr pxVar7;
  xmlNotationPtr pxVar8;
  xmlChar *name;
  xmlEnumerationPtr pxVar9;
  xmlChar *prefix_00;
  _xmlDtd *dtd;
  uint local_80;
  xmlChar fn [50];
  
  if (doc == (xmlDocPtr)0x0) {
    return 0;
  }
  dtd = doc->intSubset;
  if (dtd == (_xmlDtd *)0x0) {
    if (elem == (xmlNodePtr)0x0) {
      return 0;
    }
    if (doc->extSubset == (_xmlDtd *)0x0) {
      return 0;
    }
  }
  else if (elem == (xmlNodePtr)0x0) {
    return 0;
  }
  pxVar4 = elem->name;
  if (attr == (xmlAttrPtr)0x0 || pxVar4 == (xmlChar *)0x0) {
    return 0;
  }
  name = attr->name;
  if (name == (xmlChar *)0x0) {
    return 0;
  }
  if (attr->ns == (xmlNs *)0x0) {
    prefix_00 = (xmlChar *)0x0;
  }
  else {
    prefix_00 = attr->ns->prefix;
  }
  if ((elem->ns != (xmlNs *)0x0) && (prefix = elem->ns->prefix, prefix != (xmlChar *)0x0)) {
    pxVar4 = xmlBuildQName(pxVar4,prefix,fn,0x32);
    if (pxVar4 == (xmlChar *)0x0) {
      xmlVErrMemory(ctxt);
      return 0;
    }
    pxVar5 = xmlGetDtdQAttrDesc(doc->intSubset,pxVar4,attr->name,prefix_00);
    if (pxVar5 == (xmlAttributePtr)0x0) {
      if (doc->extSubset == (xmlDtdPtr)0x0) {
        pxVar5 = (xmlAttributePtr)0x0;
      }
      else {
        pxVar5 = xmlGetDtdQAttrDesc(doc->extSubset,pxVar4,attr->name,prefix_00);
      }
    }
    if ((pxVar4 != fn) && (pxVar4 != elem->name)) {
      (*xmlFree)(pxVar4);
    }
    if (pxVar5 != (xmlAttributePtr)0x0) goto LAB_001563c1;
    dtd = doc->intSubset;
    pxVar4 = elem->name;
    name = attr->name;
  }
  pxVar5 = xmlGetDtdQAttrDesc(dtd,pxVar4,name,prefix_00);
  if ((pxVar5 == (xmlAttributePtr)0x0) &&
     ((doc->extSubset == (xmlDtdPtr)0x0 ||
      (pxVar5 = xmlGetDtdQAttrDesc(doc->extSubset,elem->name,attr->name,prefix_00),
      pxVar5 == (xmlAttributePtr)0x0)))) {
    xmlErrValidNode(ctxt,elem,XML_DTD_UNKNOWN_ATTRIBUTE,
                    "No declaration for attribute %s of element %s\n",attr->name,elem->name,
                    (xmlChar *)0x0);
    return 0;
  }
LAB_001563c1:
  if (attr->atype == XML_ATTRIBUTE_ID) {
    xmlRemoveID(doc,attr);
  }
  xVar2 = pxVar5->atype;
  attr->atype = xVar2;
  iVar1 = xmlValidateAttributeValueInternal(doc,xVar2,value);
  if (iVar1 == 0) {
    xmlErrValidNode(ctxt,elem,XML_DTD_ATTRIBUTE_VALUE,
                    "Syntax of value for attribute %s of %s is not valid\n",attr->name,elem->name,
                    (xmlChar *)0x0);
  }
  local_80 = (uint)(iVar1 != 0);
  if ((pxVar5->def == XML_ATTRIBUTE_FIXED) &&
     (iVar1 = xmlStrEqual(value,pxVar5->defaultValue), iVar1 == 0)) {
    xmlErrValidNode(ctxt,elem,XML_DTD_ATTRIBUTE_DEFAULT,
                    "Value for attribute %s of %s is different from default \"%s\"\n",attr->name,
                    elem->name,pxVar5->defaultValue);
    local_80 = 0;
  }
  xVar2 = pxVar5->atype;
  if (xVar2 == XML_ATTRIBUTE_ID) {
    pxVar6 = xmlAddID(ctxt,doc,value,attr);
    if (pxVar6 == (xmlIDPtr)0x0) {
      local_80 = 0;
    }
    xVar2 = pxVar5->atype;
  }
  if (xVar2 - XML_ATTRIBUTE_IDREF < 2) {
    pxVar7 = xmlAddRef(ctxt,doc,value,attr);
    if (pxVar7 == (xmlRefPtr)0x0) {
      local_80 = 0;
    }
    xVar2 = pxVar5->atype;
  }
  if (xVar2 == XML_ATTRIBUTE_NOTATION) {
    pxVar9 = pxVar5->tree;
    pxVar8 = xmlGetDtdNotationDesc(doc->intSubset,value);
    if ((pxVar8 == (xmlNotationPtr)0x0) &&
       (pxVar8 = xmlGetDtdNotationDesc(doc->extSubset,value), pxVar8 == (xmlNotationPtr)0x0)) {
      xmlErrValidNode(ctxt,elem,XML_DTD_UNKNOWN_NOTATION,
                      "Value \"%s\" for attribute %s of %s is not a declared Notation\n",value,
                      attr->name,elem->name);
      local_80 = 0;
    }
    for (; pxVar9 != (xmlEnumerationPtr)0x0; pxVar9 = pxVar9->next) {
      iVar1 = xmlStrEqual(pxVar9->name,value);
      if (iVar1 != 0) goto LAB_001565c4;
    }
    xmlErrValidNode(ctxt,elem,XML_DTD_NOTATION_VALUE,
                    "Value \"%s\" for attribute %s of %s is not among the enumerated notations\n",
                    value,attr->name,elem->name);
    local_80 = 0;
  }
LAB_001565c4:
  if (pxVar5->atype == XML_ATTRIBUTE_ENUMERATION) {
    pxVar9 = (xmlEnumerationPtr)&pxVar5->tree;
    do {
      pxVar9 = pxVar9->next;
      if (pxVar9 == (xmlEnumerationPtr)0x0) {
        xmlErrValidNode(ctxt,elem,XML_DTD_ATTRIBUTE_VALUE,
                        "Value \"%s\" for attribute %s of %s is not among the enumerated set\n",
                        value,attr->name,elem->name);
        local_80 = 0;
        break;
      }
      iVar1 = xmlStrEqual(pxVar9->name,value);
    } while (iVar1 == 0);
  }
  if ((pxVar5->def == XML_ATTRIBUTE_FIXED) &&
     (iVar1 = xmlStrEqual(pxVar5->defaultValue,value), iVar1 == 0)) {
    xmlErrValidNode(ctxt,elem,XML_DTD_ATTRIBUTE_VALUE,
                    "Value for attribute %s of %s must be \"%s\"\n",attr->name,elem->name,
                    pxVar5->defaultValue);
    local_80 = 0;
  }
  uVar3 = xmlValidateAttributeValue2(ctxt,doc,attr->name,pxVar5->atype,value);
  return uVar3 & local_80;
}

Assistant:

int
xmlValidateOneAttribute(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                        xmlNodePtr elem, xmlAttrPtr attr, const xmlChar *value)
{
    xmlAttributePtr attrDecl =  NULL;
    const xmlChar *aprefix;
    int val;
    int ret = 1;

    CHECK_DTD;
    if ((elem == NULL) || (elem->name == NULL)) return(0);
    if ((attr == NULL) || (attr->name == NULL)) return(0);

    aprefix = (attr->ns != NULL) ? attr->ns->prefix : NULL;

    if ((elem->ns != NULL) && (elem->ns->prefix != NULL)) {
	xmlChar fn[50];
	xmlChar *fullname;

	fullname = xmlBuildQName(elem->name, elem->ns->prefix, fn, 50);
	if (fullname == NULL) {
            xmlVErrMemory(ctxt);
	    return(0);
        }
        attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, fullname,
                                      attr->name, aprefix);
        if ((attrDecl == NULL) && (doc->extSubset != NULL))
            attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, fullname,
                                          attr->name, aprefix);
	if ((fullname != fn) && (fullname != elem->name))
	    xmlFree(fullname);
    }
    if (attrDecl == NULL) {
        attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, elem->name,
                                      attr->name, aprefix);
        if ((attrDecl == NULL) && (doc->extSubset != NULL))
            attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, elem->name,
                                          attr->name, aprefix);
    }


    /* Validity Constraint: Attribute Value Type */
    if (attrDecl == NULL) {
	xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_ATTRIBUTE,
	       "No declaration for attribute %s of element %s\n",
	       attr->name, elem->name, NULL);
	return(0);
    }
    if (attr->atype == XML_ATTRIBUTE_ID)
        xmlRemoveID(doc, attr);
    attr->atype = attrDecl->atype;

    val = xmlValidateAttributeValueInternal(doc, attrDecl->atype, value);
    if (val == 0) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_VALUE,
	   "Syntax of value for attribute %s of %s is not valid\n",
	       attr->name, elem->name, NULL);
        ret = 0;
    }

    /* Validity constraint: Fixed Attribute Default */
    if (attrDecl->def == XML_ATTRIBUTE_FIXED) {
	if (!xmlStrEqual(value, attrDecl->defaultValue)) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_DEFAULT,
	   "Value for attribute %s of %s is different from default \"%s\"\n",
		   attr->name, elem->name, attrDecl->defaultValue);
	    ret = 0;
	}
    }

    /* Validity Constraint: ID uniqueness */
    if (attrDecl->atype == XML_ATTRIBUTE_ID) {
        if (xmlAddID(ctxt, doc, value, attr) == NULL)
	    ret = 0;
    }

    if ((attrDecl->atype == XML_ATTRIBUTE_IDREF) ||
	(attrDecl->atype == XML_ATTRIBUTE_IDREFS)) {
        if (xmlAddRef(ctxt, doc, value, attr) == NULL)
	    ret = 0;
    }

    /* Validity Constraint: Notation Attributes */
    if (attrDecl->atype == XML_ATTRIBUTE_NOTATION) {
        xmlEnumerationPtr tree = attrDecl->tree;
        xmlNotationPtr nota;

        /* First check that the given NOTATION was declared */
	nota = xmlGetDtdNotationDesc(doc->intSubset, value);
	if (nota == NULL)
	    nota = xmlGetDtdNotationDesc(doc->extSubset, value);

	if (nota == NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_NOTATION,
       "Value \"%s\" for attribute %s of %s is not a declared Notation\n",
		   value, attr->name, elem->name);
	    ret = 0;
        }

	/* Second, verify that it's among the list */
	while (tree != NULL) {
	    if (xmlStrEqual(tree->name, value)) break;
	    tree = tree->next;
	}
	if (tree == NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_NOTATION_VALUE,
"Value \"%s\" for attribute %s of %s is not among the enumerated notations\n",
		   value, attr->name, elem->name);
	    ret = 0;
	}
    }

    /* Validity Constraint: Enumeration */
    if (attrDecl->atype == XML_ATTRIBUTE_ENUMERATION) {
        xmlEnumerationPtr tree = attrDecl->tree;
	while (tree != NULL) {
	    if (xmlStrEqual(tree->name, value)) break;
	    tree = tree->next;
	}
	if (tree == NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_VALUE,
       "Value \"%s\" for attribute %s of %s is not among the enumerated set\n",
		   value, attr->name, elem->name);
	    ret = 0;
	}
    }

    /* Fixed Attribute Default */
    if ((attrDecl->def == XML_ATTRIBUTE_FIXED) &&
        (!xmlStrEqual(attrDecl->defaultValue, value))) {
	xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_VALUE,
	   "Value for attribute %s of %s must be \"%s\"\n",
	       attr->name, elem->name, attrDecl->defaultValue);
        ret = 0;
    }

    /* Extra check for the attribute value */
    ret &= xmlValidateAttributeValue2(ctxt, doc, attr->name,
				      attrDecl->atype, value);

    return(ret);
}